

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereShape.cpp
# Opt level: O3

void __thiscall
btSphereShape::getAabb(btSphereShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])();
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  uVar1 = *(undefined8 *)(t->m_origin).m_floats;
  auVar2._4_4_ = (float)((ulong)uVar1 >> 0x20) - extraout_XMM0_Da_00;
  auVar2._0_4_ = (float)uVar1 - extraout_XMM0_Da;
  auVar2._8_4_ = (t->m_origin).m_floats[2] - extraout_XMM0_Da_01;
  auVar2._12_4_ = 0;
  *(undefined1 (*) [16])aabbMin->m_floats = auVar2;
  uVar1 = *(undefined8 *)(t->m_origin).m_floats;
  auVar3._4_4_ = (float)((ulong)uVar1 >> 0x20) + extraout_XMM0_Da_00;
  auVar3._0_4_ = (float)uVar1 + extraout_XMM0_Da;
  auVar3._8_4_ = extraout_XMM0_Da_01 + (t->m_origin).m_floats[2];
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar3;
  return;
}

Assistant:

void btSphereShape::getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
	const btVector3& center = t.getOrigin();
	btVector3 extent(getMargin(),getMargin(),getMargin());
	aabbMin = center - extent;
	aabbMax = center + extent;
}